

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ExpressionColumnReader::Read
          (ExpressionColumnReader *this,uint64_t num_values,data_ptr_t define_out,
          data_ptr_t repeat_out,Vector *result)

{
  DataChunk *this_00;
  int iVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined4 extraout_var;
  
  this_00 = &this->intermediate_chunk;
  DataChunk::Reset(this_00);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(&this->child_reader);
  iVar1 = (*pCVar3->_vptr_ColumnReader[3])(pCVar3,num_values,define_out,repeat_out,pvVar2);
  (this->intermediate_chunk).count = CONCAT44(extraout_var,iVar1);
  ExpressionExecutor::ExecuteExpression(&this->executor,this_00,result);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

idx_t ExpressionColumnReader::Read(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	intermediate_chunk.Reset();
	auto &intermediate_vector = intermediate_chunk.data[0];

	auto amount = child_reader->Read(num_values, define_out, repeat_out, intermediate_vector);
	// Execute the expression
	intermediate_chunk.SetCardinality(amount);
	executor.ExecuteExpression(intermediate_chunk, result);
	return amount;
}